

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

void mbedtls_ecp_group_init(mbedtls_ecp_group *grp)

{
  grp->id = MBEDTLS_ECP_DP_NONE;
  mbedtls_mpi_init(&grp->P);
  mbedtls_mpi_init(&grp->A);
  mbedtls_mpi_init(&grp->B);
  mbedtls_ecp_point_init(&grp->G);
  mbedtls_mpi_init(&grp->N);
  grp->h = 0;
  grp->pbits = 0;
  grp->nbits = 0;
  grp->modp = (_func_int_mbedtls_mpi_ptr *)0x0;
  grp->t_pre = (_func_int_mbedtls_ecp_point_ptr_void_ptr *)0x0;
  grp->t_post = (_func_int_mbedtls_ecp_point_ptr_void_ptr *)0x0;
  grp->t_data = (void *)0x0;
  grp->T = (mbedtls_ecp_point *)0x0;
  grp->T_size = 0;
  return;
}

Assistant:

void mbedtls_ecp_group_init(mbedtls_ecp_group *grp)
{
    grp->id = MBEDTLS_ECP_DP_NONE;
    mbedtls_mpi_init(&grp->P);
    mbedtls_mpi_init(&grp->A);
    mbedtls_mpi_init(&grp->B);
    mbedtls_ecp_point_init(&grp->G);
    mbedtls_mpi_init(&grp->N);
    grp->pbits = 0;
    grp->nbits = 0;
    grp->h = 0;
    grp->modp = NULL;
    grp->t_pre = NULL;
    grp->t_post = NULL;
    grp->t_data = NULL;
    grp->T = NULL;
    grp->T_size = 0;
}